

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

void __thiscall Blip_Buffer::mix_samples(Blip_Buffer *this,blip_sample_t *in,long count)

{
  short sVar1;
  blip_long s;
  int prev;
  int sample_shift;
  buf_t_ *out;
  long count_local;
  blip_sample_t *in_local;
  Blip_Buffer *this_local;
  
  if (this->buffer_size_ != 1) {
    out = this->buffer_ + (ulong)(this->offset_ >> 0x10) + 8;
    prev = 0;
    count_local = count;
    in_local = in;
    while (count_local != 0) {
      sVar1 = *in_local;
      *out = (sVar1 * 0x4000 - prev) + *out;
      out = out + 1;
      prev = sVar1 * 0x4000;
      count_local = count_local + -1;
      in_local = in_local + 1;
    }
    *out = *out - prev;
  }
  return;
}

Assistant:

void Blip_Buffer::mix_samples( blip_sample_t const* in, long count )
{
	if ( buffer_size_ == silent_buf_size )
	{
		assert( 0 );
		return;
	}
	
	buf_t_* out = buffer_ + (offset_ >> BLIP_BUFFER_ACCURACY) + blip_widest_impulse_ / 2;
	
	int const sample_shift = blip_sample_bits - 16;
	int prev = 0;
	while ( count-- )
	{
		blip_long s = (blip_long) *in++ << sample_shift;
		*out += s - prev;
		prev = s;
		++out;
	}
	*out -= prev;
}